

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

StringRef __thiscall llvm::sys::path::extension(path *this,StringRef path,Style style)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  StringRef path_00;
  StringRef SVar4;
  StringRef fname;
  
  path_00.Length = path.Data;
  path_00.Data = (char *)this;
  fname = filename(path_00,(Style)path.Length);
  sVar1 = StringRef::rfind(&fname,'.',0xffffffffffffffff);
  if (sVar1 == 0xffffffffffffffff) {
LAB_00142023:
    sVar3 = 0;
    pcVar2 = (char *)0x0;
  }
  else {
    if (fname.Length == 2) {
      if (*(short *)fname.Data == 0x2e2e) goto LAB_00142023;
    }
    else if (fname.Length == 1) {
      sVar3 = 0;
      pcVar2 = (char *)0x0;
      if (*fname.Data == '.') goto LAB_00142027;
    }
    if (fname.Length < sVar1) {
      sVar1 = fname.Length;
    }
    pcVar2 = fname.Data + sVar1;
    sVar3 = fname.Length - sVar1;
  }
LAB_00142027:
  SVar4.Length = sVar3;
  SVar4.Data = pcVar2;
  return SVar4;
}

Assistant:

StringRef extension(StringRef path, Style style) {
  StringRef fname = filename(path, style);
  size_t pos = fname.find_last_of('.');
  if (pos == StringRef::npos)
    return StringRef();
  else
    if ((fname.size() == 1 && fname == ".") ||
        (fname.size() == 2 && fname == ".."))
      return StringRef();
    else
      return fname.substr(pos);
}